

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcondensedcompel.cpp
# Opt level: O0

void __thiscall
TPZCondensedCompEl::TPZCondensedCompEl
          (TPZCondensedCompEl *this,TPZCondensedCompEl *copy,TPZCompMesh *mesh)

{
  int iVar1;
  TPZCompEl *this_00;
  TPZCompMesh *pTVar2;
  TPZGeoEl *this_01;
  int64_t referenceindex;
  TPZChunkVector<TPZCompEl_*,_10> *this_02;
  TPZAdmChunkVector<TPZCompEl_*,_10> *nelem;
  TPZCompEl **ppTVar3;
  long *plVar4;
  undefined8 in_RDX;
  long in_RSI;
  long index;
  TPZCompEl *in_RDI;
  int i;
  int ncon;
  TPZCompEl *ref;
  TPZCompEl *in_stack_00000120;
  size_t in_stack_00000358;
  char *in_stack_00000360;
  int64_t in_stack_ffffffffffffff38;
  TPZVec<long> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int64_t in_stack_ffffffffffffff58;
  TPZManVector<long,_62> *in_stack_ffffffffffffff60;
  TPZMatRed<double,_TPZFMatrix<double>_> *in_stack_ffffffffffffff90;
  int local_48;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZCondensedCompEl>((TPZRegisterClassId *)in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_024fe728);
  TPZCompEl::TPZCompEl(in_RDI,&PTR_PTR_024fe710);
  *(undefined ***)in_RDI = &PTR__TPZCondensedCompEl_024fe4c0;
  *(undefined ***)in_RDI = &PTR__TPZCondensedCompEl_024fe4c0;
  *(undefined8 *)(in_RDI + 1) = 0;
  in_RDI[1].fMesh = (TPZCompMesh *)0x0;
  TPZMatRed<double,_TPZFMatrix<double>_>::TPZMatRed(in_stack_ffffffffffffff90);
  TPZManVector<long,_62>::TPZManVector(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  TPZManVector<long,_55>::TPZManVector
            ((TPZManVector<long,_55> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  TPZManVector<long,_10>::TPZManVector
            ((TPZManVector<long,_10> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  *(undefined1 *)&in_RDI[0x31].fIndex = 1;
  this_00 = (TPZCompEl *)
            (**(code **)(*(long *)in_RDI[0x15].fIndex + 0x48))((long *)in_RDI[0x15].fIndex,in_RDX);
  if (this_00 == (TPZCompEl *)0x0) {
    pzinternal::DebugStopImpl(in_stack_00000360,in_stack_00000358);
  }
  in_RDI[0x15].fIndex = (int64_t)this_00;
  pTVar2 = TPZCompEl::Mesh(in_stack_00000120);
  in_RDI->fMesh = pTVar2;
  *(byte *)&in_RDI[0x31].fIndex = *(byte *)(in_RSI + 0x7b8) & 1;
  this_01 = TPZCompEl::Reference
                      ((TPZCompEl *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  referenceindex = TPZGeoEl::Index(this_01);
  TPZCompEl::SetReference(in_RDI,referenceindex);
  this_02 = (TPZChunkVector<TPZCompEl_*,_10> *)TPZCompEl::Index(this_00);
  TPZCompEl::SetIndex(in_RDI,(int64_t)this_02);
  nelem = TPZCompMesh::ElementVec(in_RDI->fMesh);
  ppTVar3 = TPZChunkVector<TPZCompEl_*,_10>::operator[](this_02,(int64_t)nelem);
  *ppTVar3 = in_RDI;
  iVar1 = (**(code **)(*(long *)this_00 + 0x90))();
  TPZVec<long>::resize(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  for (local_48 = 0; local_48 < iVar1; local_48 = local_48 + 1) {
    index = (long)local_48;
    plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)&in_RDI[0x15].fReferenceIndex,index);
    *plVar4 = index;
  }
  return;
}

Assistant:

TPZCondensedCompEl::TPZCondensedCompEl(const TPZCondensedCompEl &copy, TPZCompMesh &mesh) : TPZRegisterClassId(&TPZCondensedCompEl::ClassId)
{
    TPZCompEl *ref = fReferenceCompEl->Clone(mesh);
    if(!ref)
    {
        DebugStop();
    }
    fReferenceCompEl = ref;
    fMesh = ref->Mesh();
    fKeepMatrix = copy.fKeepMatrix;
    SetReference(ref->Reference()->Index());
    SetIndex(ref->Index());
    fMesh->ElementVec()[fIndex] = this;
    int ncon = ref->NConnects();
    fIndexes.resize(ncon);
    for (int i=0; i<ncon ; ++i) {
        fIndexes[i] = i;
    }
}